

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O2

void test_mu_producer_consumer5(testing t)

{
  closure_t_producer_mu_n_0 a0;
  closure *cl;
  int in_ECX;
  undefined4 extraout_EDX;
  int start;
  undefined4 extraout_var;
  closure_t_producer_mu_n_3 in_R8D;
  
  a0 = (closure_t_producer_mu_n_0)mu_queue_new(100000);
  cl = closure_producer_mu_n
                 ((_func_void_closure_t_producer_mu_n_0_closure_t_producer_mu_n_1_closure_t_producer_mu_n_2_closure_t_producer_mu_n_3
                   *)t,a0,(closure_t_producer_mu_n_1)CONCAT44(extraout_var,extraout_EDX),in_ECX,
                  in_R8D);
  closure_fork(cl);
  consumer_mu_n(t,(mu_queue *)a0,start,in_ECX);
  free(a0);
  return;
}

Assistant:

static void test_mu_producer_consumer5 (testing t) {
	mu_queue *q = mu_queue_new (100000);
	closure_fork (closure_producer_mu_n (&producer_mu_n, t, q, 0, MU_PRODUCER_CONSUMER_N));
	consumer_mu_n (t, q, 0, MU_PRODUCER_CONSUMER_N);
	free (q);
}